

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int rank(double *A,int M,int N)

{
  double *col;
  double *AT;
  int rnk;
  int N_local;
  int M_local;
  double *A_local;
  
  col = (double *)malloc((long)M * 8 * (long)N);
  if (M < N) {
    mtranspose(A,M,N,col);
    AT._4_4_ = rank_c(col,N,M);
  }
  else {
    AT._4_4_ = rank_c(A,M,N);
  }
  free(col);
  return AT._4_4_;
}

Assistant:

int rank(double *A, int M,int N) {
	int rnk;
	double *AT;

	AT = (double*) malloc(sizeof(double) * M*N);

	if (M < N) {
		mtranspose(A,M,N,AT);
		rnk = rank_c(AT,N,M);
	} else {
		rnk = rank_c(A,M,N);
	}

	free(AT);
	return rnk;

}